

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::ConvertToHalfPass::EquivFloatTypeId
          (ConvertToHalfPass *this,uint32_t ty_id,uint32_t width)

{
  IRContext *pIVar1;
  uint32_t v_cnt;
  uint32_t uVar2;
  Instruction *this_00;
  Type *type;
  uint uVar3;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = analysis::DefUseManager::GetDef
                      ((pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,ty_id);
  if (this_00->opcode_ == OpTypeVector) {
    uVar3 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar3 = (uint)this_00->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(this_00,uVar3 + 1);
    type = FloatVectorType(this,uVar2,width);
  }
  else if (this_00->opcode_ == OpTypeMatrix) {
    uVar3 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar3 = (uint)this_00->has_result_id_;
    }
    v_cnt = Instruction::GetSingleWordOperand(this_00,uVar3 + 1);
    uVar2 = (this_00->has_result_id_ & 1) + 1;
    if (this_00->has_type_id_ == false) {
      uVar2 = (uint)this_00->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(this_00,uVar2);
    type = FloatMatrixType(this,v_cnt,uVar2,width);
  }
  else {
    type = FloatScalarType(this,width);
  }
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  uVar2 = analysis::TypeManager::GetTypeInstruction
                    ((pIVar1->type_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                     _M_head_impl,type);
  return uVar2;
}

Assistant:

uint32_t ConvertToHalfPass::EquivFloatTypeId(uint32_t ty_id, uint32_t width) {
  analysis::Type* reg_equiv_ty;
  Instruction* ty_inst = get_def_use_mgr()->GetDef(ty_id);
  if (ty_inst->opcode() == spv::Op::OpTypeMatrix)
    reg_equiv_ty = FloatMatrixType(ty_inst->GetSingleWordInOperand(1),
                                   ty_inst->GetSingleWordInOperand(0), width);
  else if (ty_inst->opcode() == spv::Op::OpTypeVector)
    reg_equiv_ty = FloatVectorType(ty_inst->GetSingleWordInOperand(1), width);
  else  // spv::Op::OpTypeFloat
    reg_equiv_ty = FloatScalarType(width);
  return context()->get_type_mgr()->GetTypeInstruction(reg_equiv_ty);
}